

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

size_t Extract(string *where_from,string *where_to,size_t pos,char delim)

{
  size_t sVar1;
  undefined7 in_register_00000009;
  long *local_48 [2];
  long local_38 [2];
  
  sVar1 = std::__cxx11::string::find
                    ((char)where_from,CONCAT71(in_register_00000009,delim) & 0xffffffff);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::string::_M_assign((string *)where_to);
  }
  else {
    std::__cxx11::string::substr((ulong)local_48,(ulong)where_from);
    std::__cxx11::string::operator=((string *)where_to,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return sVar1;
}

Assistant:

size_t Extract(const std::string& where_from, std::string& where_to, size_t pos, const char delim)
{
    size_t end = where_from.find_first_of(delim, pos);
    
    if (end != std::string::npos)
        where_to = where_from.substr(pos, end - pos);
    else
        where_to = where_from;
    
    return end;
}